

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  ushort uVar1;
  short sVar2;
  uint *puVar3;
  short sVar4;
  int iVar5;
  int *piVar6;
  short *psVar7;
  uLong uVar8;
  void *pvVar9;
  char *fmt;
  long request;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  long local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar3 = (uint *)a->format->data;
  if (puVar3[0x13c4] == 0xffffffff) {
    puVar3[0x13c4] = 0;
  }
  piVar6 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar6 == (int *)0x0) {
    iVar5 = 1;
  }
  else {
    if ((puVar3[0x3e] != 0) ||
       ((((char)*piVar6 != 'M' || (*(char *)((long)piVar6 + 1) != 'Z')) && (*piVar6 != 0x464c457f)))
       ) {
LAB_003f1116:
      puVar3[0x3e] = 1;
LAB_003f1127:
      psVar7 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if (psVar7 == (short *)0x0) goto LAB_003f1393;
      sVar4 = psVar7[1];
      switch((char)sVar4) {
      case 'r':
        uVar11 = 7;
        iVar5 = bcmp(psVar7,"Rar!\x1a\a",7);
        if (iVar5 != 0) {
          fmt = "Invalid marker header";
          goto LAB_003f1386;
        }
        break;
      case 's':
        *puVar3 = (uint)*(ushort *)((long)psVar7 + 3);
        uVar1 = *(ushort *)((long)psVar7 + 5);
        uVar11 = (ulong)uVar1;
        if (uVar11 < 0xd) goto LAB_003f12d9;
        psVar7 = (short *)__archive_read_ahead(a,uVar11,(ssize_t *)0x0);
        if (psVar7 == (short *)0x0) goto LAB_003f1393;
        *(undefined2 *)(puVar3 + 4) = *(undefined2 *)((long)psVar7 + 7);
        *(undefined4 *)((long)puVar3 + 0x12) = *(undefined4 *)((long)psVar7 + 9);
        if ((*puVar3 >> 9 & 1) != 0) {
          if (uVar1 == 0xd) goto LAB_003f12d9;
          *(undefined1 *)((long)puVar3 + 0x16) = *(undefined1 *)((long)psVar7 + 0xd);
        }
        if ((char)*puVar3 < '\0') {
          archive_entry_set_is_metadata_encrypted(entry,'\x01');
          archive_entry_set_is_data_encrypted(entry,'\x01');
          puVar3[0x13c4] = 1;
          fmt = "RAR encryption support unavailable.";
          goto LAB_003f1386;
        }
        uVar8 = cm_zlib_crc32(0,(uchar *)(psVar7 + 1),uVar1 - 2);
        if (*psVar7 != (short)uVar8) goto LAB_003f137f;
        break;
      case 't':
        iVar5 = read_header(a,entry,'t');
        return iVar5;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar1 = *(ushort *)((long)psVar7 + 5);
        uVar11 = (ulong)uVar1;
        if (uVar11 < 7) {
LAB_003f12d9:
          fmt = "Invalid header size";
          goto LAB_003f1386;
        }
        sVar2 = *(short *)((long)psVar7 + 3);
        if (uVar1 == 7) {
          uVar11 = 7;
          if (sVar2 < 0) goto LAB_003f12d9;
        }
        else {
          psVar7 = (short *)__archive_read_ahead(a,uVar11,(ssize_t *)0x0);
          if (psVar7 == (short *)0x0) goto LAB_003f1393;
          if (sVar2 < 0) {
            if (uVar1 < 0xb) goto LAB_003f12d9;
            uVar11 = uVar11 + *(uint *)((long)psVar7 + 7);
            psVar7 = (short *)__archive_read_ahead(a,uVar11,(ssize_t *)0x0);
            if (psVar7 == (short *)0x0) goto LAB_003f1393;
          }
        }
        uVar8 = cm_zlib_crc32(0,(uchar *)(psVar7 + 1),(int)uVar11 - 2);
        if (*psVar7 != (short)uVar8) {
LAB_003f137f:
          fmt = "Header CRC error";
          goto LAB_003f1386;
        }
        __archive_read_consume(a,uVar11);
        if ((char)sVar4 == '{') {
          return 1;
        }
        goto LAB_003f1127;
      case 'z':
        goto switchD_003f1158_caseD_7a;
      default:
        fmt = "Bad RAR file";
        goto LAB_003f1386;
      }
      __archive_read_consume(a,uVar11);
      goto LAB_003f1127;
    }
    uVar11 = 0x1000;
    lVar12 = 0;
    while( true ) {
      while( true ) {
        if (0x20000 < uVar11 + lVar12) goto LAB_003f1376;
        pvVar9 = __archive_read_ahead(a,uVar11,&local_38);
        if (pvVar9 != (void *)0x0) break;
        bVar13 = uVar11 < 0x80;
        uVar11 = uVar11 >> 1;
        if (bVar13) goto LAB_003f1376;
      }
      if (local_38 < 0x40) break;
      uVar10 = local_38 + (long)pvVar9;
      for (request = 0; (ulong)((long)pvVar9 + request + 7) < uVar10; request = request + 0x10) {
        iVar5 = bcmp((void *)((long)pvVar9 + request),"Rar!\x1a\a",7);
        if (iVar5 == 0) {
          __archive_read_consume(a,request);
          goto LAB_003f1116;
        }
      }
      __archive_read_consume(a,request);
      lVar12 = lVar12 + request;
    }
LAB_003f1376:
    fmt = "Couldn\'t find out RAR header";
LAB_003f1386:
    archive_set_error(&a->archive,0x54,fmt);
LAB_003f1393:
    iVar5 = -0x1e;
  }
  return iVar5;
switchD_003f1158_caseD_7a:
  iVar5 = read_header(a,entry,'z');
  if (iVar5 < -0x14) {
    return iVar5;
  }
  goto LAB_003f1127;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrytped, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if (skip > 7) {
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        skip += archive_le32dec(p + 7);
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      if (head_type == ENDARC_HEAD)
        return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}